

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost.c
# Opt level: O3

void av1_cost_tokens_from_cdf(int *costs,aom_cdf_prob *cdf,int *inv_map)

{
  ushort uVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  
  lVar3 = 0;
  iVar4 = 0;
  do {
    uVar1 = cdf[lVar3];
    iVar5 = 0x8000 - (uint)uVar1;
    uVar6 = iVar5 - iVar4 & 0xffff;
    if (uVar6 < 5) {
      uVar6 = 4;
    }
    if (0x7ffe < uVar6) {
      uVar6 = 0x7fff;
    }
    uVar2 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar6 = uVar6 << ((byte)(~uVar2 + 0xf) & 0x1f);
    lVar8 = lVar3;
    if (inv_map != (int *)0x0) {
      lVar8 = (long)inv_map[lVar3];
    }
    uVar7 = (uint)((ulong)uVar6 * 0x100 + 0x4000 >> 0xf);
    costs[lVar8] = (~uVar2 + 0xf) * 0x200 +
                   (uint)*(ushort *)
                          (block_size_high +
                          (ulong)((uVar6 < 0x40 | uVar7 | 0xff - uVar7 >> 0x17) & 0xff) * 2 + 0x10);
    lVar3 = lVar3 + 1;
    iVar4 = iVar5;
  } while (uVar1 != 0);
  return;
}

Assistant:

void av1_cost_tokens_from_cdf(int *costs, const aom_cdf_prob *cdf,
                              const int *inv_map) {
  int i;
  aom_cdf_prob prev_cdf = 0;
  for (i = 0;; ++i) {
    aom_cdf_prob p15 = AOM_ICDF(cdf[i]) - prev_cdf;
    p15 = (p15 < EC_MIN_PROB) ? EC_MIN_PROB : p15;
    prev_cdf = AOM_ICDF(cdf[i]);

    if (inv_map)
      costs[inv_map[i]] = av1_cost_symbol(p15);
    else
      costs[i] = av1_cost_symbol(p15);

    // Stop once we reach the end of the CDF
    if (cdf[i] == AOM_ICDF(CDF_PROB_TOP)) break;
  }
}